

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  LogSeverity *pLVar1;
  LogDestination *this;
  lock_guard<std::mutex> local_110;
  lock_guard<std::mutex> l;
  LogMessage local_100;
  int local_9c;
  string *local_98;
  _Check_string *_result_1;
  LogMessage local_88;
  int local_24;
  string *local_20;
  _Check_string *_result;
  char *symlink_basename_local;
  LogSeverity severity_local;
  
  _result = (_Check_string *)symlink_basename;
  symlink_basename_local._4_4_ = severity;
  pLVar1 = GetReferenceableValue<google::LogSeverity>
                     ((LogSeverity *)((long)&symlink_basename_local + 4));
  local_24 = GetReferenceableValue(0);
  local_20 = Check_GEImpl<google::LogSeverity,int>(pLVar1,&local_24,"severity >= 0");
  if (local_20 != (string *)0x0) {
    CheckOpString::CheckOpString((CheckOpString *)&_result_1,local_20);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x290,(CheckOpString *)&_result_1);
    LogMessage::stream(&local_88);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
  }
  pLVar1 = GetReferenceableValue<google::LogSeverity>
                     ((LogSeverity *)((long)&symlink_basename_local + 4));
  local_9c = GetReferenceableValue(4);
  local_98 = Check_LTImpl<google::LogSeverity,int>(pLVar1,&local_9c,"severity < NUM_SEVERITIES");
  if (local_98 != (string *)0x0) {
    CheckOpString::CheckOpString((CheckOpString *)&l,local_98);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x291,(CheckOpString *)&l);
    LogMessage::stream(&local_100);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_100);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_110,(mutex_type *)log_mutex);
  this = log_destination(symlink_basename_local._4_4_);
  anon_unknown_8::LogFileObject::SetSymlinkBasename(&this->fileobject_,(char *)_result);
  std::lock_guard<std::mutex>::~lock_guard(&local_110);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}